

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSIUnit::~IfcSIUnit(IfcSIUnit *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this[-1].Name._M_dataplus._M_p = (pointer)&PTR__IfcSIUnit_0085e948;
  *(undefined ***)&this->field_0x58 = &PTR__IfcSIUnit_0085e998;
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcSIUnit_0085e970;
  puVar1 = *(undefined1 **)&(this->super_IfcNamedUnit).field_0x38;
  puVar2 = &(this->super_IfcNamedUnit).field_0x48;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  puVar1 = *(undefined1 **)
            &(this->super_IfcNamedUnit).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x10;
  puVar2 = &(this->super_IfcNamedUnit).
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  this[-1].Name._M_dataplus._M_p = (pointer)0x85e9c0;
  *(undefined8 *)&this->field_0x58 = 0x85e9e8;
  puVar2 = *(undefined1 **)((long)&this[-1].Name.field_2 + 8);
  if (puVar2 != &this[-1].field_0x98) {
    operator_delete(puVar2,*(long *)&this[-1].field_0x98 + 1);
    return;
  }
  return;
}

Assistant:

IfcSIUnit() : Object("IfcSIUnit") {}